

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_9ab804::HandleReplaceExtensionCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _List *path_00;
  cmExecutionStatus *this;
  bool bVar1;
  int iVar2;
  ArgumentParserWithOutputVariable<Arguments> *pAVar3;
  cmMakefile *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  static_string_view name;
  string *local_2b8;
  string local_240;
  string_view local_220;
  byte local_20c;
  byte local_20b;
  byte local_20a;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  cmCMakePath extension;
  undefined1 local_1a0 [8];
  cmCMakePath path;
  string inputPath;
  string local_150;
  undefined4 local_12c;
  undefined1 local_128 [8];
  Arguments arguments;
  ArgumentParserWithOutputVariable<Arguments> local_a8;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if (((anonymous_namespace)::
       HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar2 != 0)) {
    ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable(&local_a8);
    name = ::cm::operator____s("LAST_ONLY",9);
    arguments._88_8_ = name.super_string_view._M_len;
    pAVar3 = ArgumentParserWithOutputVariable<Arguments>::Bind<bool>(&local_a8,name,0x58);
    ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
              (&HandleReplaceExtensionCommand::parser,pAVar3);
    ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable(&local_a8);
    __cxa_atexit(ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable,
                 &HandleReplaceExtensionCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  ArgumentParserWithOutputVariable<Arguments>::Parse<2>
            ((Arguments *)local_128,&HandleReplaceExtensionCommand::parser,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local);
  pcVar4 = cmExecutionStatus::GetMakefile(local_20);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_128,pcVar4);
  if (bVar1) {
    args_local._7_1_ = 1;
    local_12c = 1;
  }
  else {
    pvVar5 = (anonymous_namespace)::
             CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::GetInputs_abi_cxx11_
                       ((CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                         *)&HandleReplaceExtensionCommand::parser);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar5);
    this = local_20;
    if (sVar6 < 2) {
      path_00 = &path.Path._M_cmpts;
      std::__cxx11::string::string((string *)path_00);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      bVar1 = getInputPath(pvVar7,local_20,(string *)path_00);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&extension.Path._M_cmpts,(string *)&path.Path._M_cmpts);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &extension.Path._M_cmpts,generic_format);
        std::__cxx11::string::~string((string *)&extension.Path._M_cmpts);
        local_20a = 0;
        local_20b = 0;
        local_20c = 0;
        pvVar5 = (anonymous_namespace)::
                 CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                 ::GetInputs_abi_cxx11_
                           ((CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                             *)&HandleReplaceExtensionCommand::parser);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar5);
        if (bVar1) {
          std::allocator<char>::allocator();
          local_20a = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_209);
          local_20b = 1;
        }
        else {
          pvVar5 = (anonymous_namespace)::
                   CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                   ::GetInputs_abi_cxx11_
                             ((CMakePathArgumentParser<(anonymous_namespace)::HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                               *)&HandleReplaceExtensionCommand::parser);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front(pvVar5);
          std::__cxx11::string::string((string *)&local_208,(string *)pvVar7);
          local_20c = 1;
        }
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_1e8,&local_208,generic_format);
        if ((local_20c & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_208);
        }
        if ((local_20b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_208);
        }
        if ((local_20a & 1) != 0) {
          std::allocator<char>::~allocator(&local_209);
        }
        if ((arguments.Output.
             super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_engaged & 1U) == 0) {
          cmCMakePath::ReplaceWideExtension((cmCMakePath *)local_1a0,(cmCMakePath *)local_1e8);
        }
        else {
          cmCMakePath::ReplaceExtension((cmCMakePath *)local_1a0,(cmCMakePath *)local_1e8);
        }
        pcVar4 = cmExecutionStatus::GetMakefile(local_20);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                            super__Rb_tree_header._M_node_count);
        if (bVar1) {
          local_2b8 = &std::
                       optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count)->
                       super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>;
        }
        else {
          local_2b8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,1);
        }
        cmCMakePath::String_abi_cxx11_(&local_240,(cmCMakePath *)local_1a0);
        local_220 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_240);
        cmMakefile::AddDefinition(pcVar4,local_2b8,local_220);
        std::__cxx11::string::~string((string *)&local_240);
        args_local._7_1_ = 1;
        local_12c = 1;
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_1e8);
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_1a0);
      }
      else {
        args_local._7_1_ = 0;
        local_12c = 1;
      }
      std::__cxx11::string::~string((string *)&path.Path._M_cmpts);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"REPLACE_EXTENSION called with unexpected arguments.",
                 (allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      cmExecutionStatus::SetError(this,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      args_local._7_1_ = 0;
      local_12c = 1;
    }
  }
  HandleReplaceExtensionCommand::Arguments::~Arguments((Arguments *)local_128);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleReplaceExtensionCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    bool LastOnly = false;
  };

  static auto const parser =
    ArgumentParserWithOutputVariable<Arguments>{}.Bind("LAST_ONLY"_s,
                                                       &Arguments::LastOnly);

  Arguments const arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (parser.GetInputs().size() > 1) {
    status.SetError("REPLACE_EXTENSION called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  cmCMakePath extension(
    parser.GetInputs().empty() ? "" : parser.GetInputs().front());

  if (arguments.LastOnly) {
    path.ReplaceExtension(extension);
  } else {
    path.ReplaceWideExtension(extension);
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}